

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_open_with_lock(char *file,int flags,mode_t mode,int write)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  int ret;
  int fd;
  int write_local;
  mode_t mode_local;
  int flags_local;
  char *file_local;
  
  file_local._4_4_ = kvtree_open(file,flags,(ulong)mode);
  if (file_local._4_4_ < 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    kvtree_err("Opening file for write: kvtree_open(%s) errno=%d %s @ %s:%d",file,(ulong)uVar1,
               pcVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0xd8);
  }
  else {
    iVar2 = kvtree_file_lock_read_write(file,file_local._4_4_,write);
    if (iVar2 != 0) {
      close(file_local._4_4_);
      file_local._4_4_ = iVar2;
    }
  }
  return file_local._4_4_;
}

Assistant:

int kvtree_open_with_lock(const char* file, int flags, mode_t mode, int write)
{
  /* open the file */
  int fd = kvtree_open(file, flags, mode);
  if (fd < 0) {
    kvtree_err("Opening file for write: kvtree_open(%s) errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );
    return fd;
  }

  /* acquire shared (write=0) or exclusive (write=1) file lock */
  int ret = kvtree_file_lock_read_write(file, fd, write);
  if (ret != KVTREE_SUCCESS) {
    close(fd);
    return ret;
  }

  /* return the opened file descriptor */
  return fd;
}